

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMMapping.c
# Opt level: O0

char * ARM_reg_name(csh handle,uint reg)

{
  uint reg_local;
  csh handle_local;
  
  if (reg < 0x6f) {
    handle_local = (csh)reg_name_maps[reg].name;
  }
  else {
    handle_local = 0;
  }
  return (char *)handle_local;
}

Assistant:

const char *ARM_reg_name(csh handle, unsigned int reg)
{
#ifndef CAPSTONE_DIET
	if (reg >= ARM_REG_ENDING)
		return NULL;

	return reg_name_maps[reg].name;
#else
	return NULL;
#endif
}